

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O1

void CVmBifT3::get_named_arg(uint argc)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  ushort *puVar4;
  ulong __n;
  int iVar5;
  ushort *puVar6;
  bool bVar7;
  vm_val_t *pvVar8;
  vm_val_t *argp;
  vm_val_t *local_60;
  uint local_54;
  long local_50;
  ushort *local_48;
  long local_40;
  vm_val_t *local_38;
  
  CVmBif::check_argc_range(argc,1,2);
  local_48 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
  if (local_48 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  uVar1 = *local_48;
  local_48 = local_48 + 1;
  local_50 = (long)(int)argc;
  local_54 = argc;
  if (frame_ptr_ != (vm_val_t *)0x0) {
    local_40 = local_50 * -0x10;
    pvVar8 = frame_ptr_;
    do {
      puVar4 = (ushort *)CVmRun::get_named_args_from_frame(pvVar8,&local_60);
      if (puVar4 == (ushort *)0x0) {
LAB_0025dbf0:
        bVar2 = false;
      }
      else {
        puVar6 = puVar4 + 2;
        bVar7 = false;
        iVar5 = *puVar4 + 1;
        local_38 = pvVar8;
        do {
          pvVar8 = local_60 + 1;
          __n = (ulong)((uint)*puVar6 - (uint)puVar6[-1]);
          if ((__n == uVar1) &&
             (iVar3 = bcmp(local_48,(void *)((long)puVar4 + (ulong)puVar6[-1] + 2),__n), iVar3 == 0)
             ) {
            CVmBif::retval(local_60);
            sp_ = (vm_val_t *)((long)&sp_->typ + local_40);
            bVar2 = true;
            goto LAB_0025dbe5;
          }
          puVar6 = puVar6 + 1;
          bVar7 = iVar5 + -1 < 1;
          iVar3 = iVar5 + -1;
          bVar2 = 0 < iVar5;
          iVar5 = iVar3;
          local_60 = pvVar8;
        } while (iVar3 != 0 && bVar2);
        bVar2 = false;
LAB_0025dbe5:
        pvVar8 = local_38;
        if (bVar7) goto LAB_0025dbf0;
      }
      if (bVar2) {
        return;
      }
      pvVar8 = (vm_val_t *)pvVar8[-1].val.native_desc;
    } while (pvVar8 != (vm_val_t *)0x0);
  }
  if (1 < local_54) {
    CVmBif::retval(sp_ + -2);
    sp_ = sp_ + -local_50;
    return;
  }
  err_throw_a(0x89c,1,4,local_48,(ulong)uVar1);
}

Assistant:

void CVmBifT3::get_named_arg(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the name we're looking for */
    const char *name = G_stk->get(0)->get_as_string(vmg0_);
    if (name == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer pointer */
    size_t namelen = vmb_get_len(name);
    name += VMB_LEN;

    /* 
     *   Scan the stack for named parameter tables.  A named parameter table
     *   is always in the calling frame at the stack slot just beyond the
     *   last argument.  
     */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* check for a table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* scan the table for the name */
            for (int i = 0 ; n >= 0 ; --n, i += 2, ++argp)
            {
                /* get this element's offset, and figure its length */
                uint eofs = osrp2(t + i);
                uint elen = osrp2(t + i + 2) - eofs;

                /* check for a match */
                if (elen == namelen && memcmp(name, t + eofs, elen) == 0)
                {
                    /* found it - return the value */
                    retval(vmg_ argp);

                    /* discard arguments and return */
                    G_stk->discard(argc);
                    return;
                }
            }
        }
    }

    /* 
     *   The argument is undefined.  If a default value was supplied, simply
     *   return the default value.  Otherwise throw an error.  
     */
    if (argc >= 2)
    {
        /* a default value was supplied - simply return it */
        retval(vmg_ G_stk->get(1));

        /* discard arguments */
        G_stk->discard(argc);
    }
    else
    {
        /* no default value - throw an error */
        err_throw_a(VMERR_MISSING_NAMED_ARG, 1, ERR_TYPE_TEXTCHAR_LEN,
                    name, namelen);
    }
}